

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_card_mtr1.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  uint local_d8 [2];
  uint local_d0;
  char *local_c8;
  uint local_c0;
  uint local_b8;
  uint local_b0;
  uint local_a8;
  uint local_a0;
  uint local_98;
  card_entry_mtr1_t *local_90;
  undefined1 *local_88;
  uint local_7c;
  undefined1 local_75;
  uint local_74;
  card_entry_mtr1_t *local_70;
  card_entry_mtr1_t *pcard;
  dlog_mt_card_table_mtr1_t *ptable;
  int local_58;
  int ret;
  int j;
  int index;
  FILE *ostream;
  FILE *instream;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  _j = (FILE *)0x0;
  ptable._4_4_ = 0;
  instream = (FILE *)argv;
  argv_local._0_4_ = argc;
  if (argc < 2) {
    printf("Usage:\n\tmm_card mm_table_%02x.bin [outputfile.bin]\n",0x16);
    argv_local._4_4_ = -1;
  }
  else {
    pcVar2 = table_to_string('\x16');
    printf("Nortel Millennium %s Table %d (0x%02x) Dump\n\n",pcVar2,0x16);
    pcard = (card_entry_mtr1_t *)calloc(1,0x294);
    if (pcard == (card_entry_mtr1_t *)0x0) {
      printf("Failed to allocate %zu bytes.\n",0x294);
      argv_local._4_4_ = -0xc;
    }
    else {
      ostream = (FILE *)fopen(instream->_IO_read_ptr,"rb");
      if ((FILE *)ostream == (FILE *)0x0) {
        printf("Error opening %s\n",instream->_IO_read_ptr);
        free(pcard);
        argv_local._4_4_ = -2;
      }
      else {
        iVar1 = mm_validate_table_fsize('\x16',ostream,0x294);
        if (iVar1 == 0) {
          sVar3 = fread(pcard,0x294,1,(FILE *)ostream);
          if (sVar3 == 1) {
            fclose((FILE *)ostream);
            printf(
                  "+-------------------------------------------------------+---------------+\n| Idx  | PAN St - End    | STD CD | Vfy | Carrier | Ref | P exp ini dis |\n+------+-----------------+--------+-----+---------+-----+---------------+"
                  );
            for (ret = 0; ret < 0x14; ret = ret + 1) {
              local_70 = pcard + ret;
              if (pcard[ret].standard_cd != '\0') {
                local_7c = (uint)local_70->pan_start[1];
                local_c8 = standard_cd_str[local_70->standard_cd & 0xf];
                local_98 = (uint)local_70->p_disc_data;
                local_a0 = (uint)local_70->p_init_date;
                local_a8 = (uint)local_70->p_exp_date;
                local_b0 = (uint)local_70->ref_num;
                local_b8 = (uint)local_70->carrier_ref;
                local_c0 = (uint)local_70->vfy_flags;
                local_d0 = (uint)local_70->pan_end[2];
                local_d8[0] = (uint)local_70->pan_end[1];
                local_75 = 0;
                local_90 = local_70;
                local_88 = (undefined1 *)local_d8;
                printf("\n|  %2d  | %02x%02x%02x - %02x%02x%02x | %s | x%02x |   0x%02x  | x%02x | P x%02x x%02x x%02x |"
                       ,(ulong)(uint)ret,(ulong)local_70->pan_start[0],(ulong)local_7c,
                       (ulong)local_70->pan_start[2],(ulong)local_70->pan_end[0]);
                print_bits(local_70->vfy_flags ^ 4,str_vfy_flags);
                printf("\n|      | Service Codes: ");
                local_74 = (uint)local_70->standard_cd;
                if (local_74 - 2 < 6) {
                  for (local_58 = 0; local_58 < 5; local_58 = local_58 + 1) {
                    printf("%04x,",(ulong)*(ushort *)(local_70->pan_end + (long)local_58 * 2 + 8));
                  }
                  printf("Spill: ");
                  for (local_58 = 0; local_58 < 8; local_58 = local_58 + 1) {
                    printf("%02x,",(ulong)local_70->pan_end[(long)local_58 + 0x12]);
                  }
                  printf(" TC:%02x ",(ulong)(local_70->svc_code).raw[0x12]);
                  printf("DI:%02x |\n",(ulong)(local_70->svc_code).raw[0x13]);
                }
                else if (local_74 == 10) {
                  printf("Ck Digits: ");
                  for (local_58 = 0; local_58 < 5; local_58 = local_58 + 1) {
                    printf("%02x,",(ulong)local_70->pan_end[(long)local_58 + 9]);
                  }
                  printf("     Ck Value: ");
                  for (local_58 = 0; local_58 < 8; local_58 = local_58 + 1) {
                    printf("%02x,",(ulong)local_70->pan_end[(long)local_58 + 0xe]);
                  }
                  printf(" |\n|      |                Manufacturer: ");
                  for (local_58 = 0; local_58 < 5; local_58 = local_58 + 1) {
                    printf("%02x,",(ulong)local_70->pan_end[(long)local_58 + 0x16]);
                  }
                  printf("     Discount Index: %02x                 |\n",
                         (ulong)(local_70->svc_code).raw[0x13]);
                }
                else {
                  for (local_58 = 0; local_58 < 0x14; local_58 = local_58 + 1) {
                    printf("%02x,",(ulong)local_70->pan_end[(long)local_58 + 8]);
                  }
                  printf("         |\n");
                }
                printf("+------+-----------------+--------+-----+---------+-----+---------------+");
              }
            }
            printf("\n");
            if (((int)argv_local == 3) &&
               (_j = fopen(instream->_IO_read_end,"wb"), _j == (FILE *)0x0)) {
              printf("Error opening output file %s for write.\n",instream->_IO_read_end);
              argv_local._4_4_ = -2;
            }
            else {
              pcard->carrier_ref = '\0';
              pcard[1].carrier_ref = '\0';
              pcard[2].carrier_ref = '\0';
              pcard[3].carrier_ref = '\0';
              pcard[4].carrier_ref = '\0';
              pcard[5].carrier_ref = '\0';
              pcard[6].carrier_ref = '\0';
              pcard[7].carrier_ref = '\0';
              pcard[8].carrier_ref = '\0';
              pcard[9].carrier_ref = '\0';
              pcard[10].carrier_ref = '\0';
              pcard[0xb].carrier_ref = '\0';
              pcard[0xc].carrier_ref = '\0';
              pcard[0xd].carrier_ref = '\0';
              pcard->ref_num = '\x10';
              pcard[1].ref_num = '\x11';
              pcard[2].ref_num = '\x12';
              pcard[3].ref_num = '\x13';
              pcard[4].ref_num = '\x14';
              pcard[5].ref_num = '\x15';
              pcard[6].ref_num = '\x16';
              pcard[7].ref_num = '\x17';
              pcard[8].ref_num = '\x18';
              pcard[9].ref_num = '\x19';
              pcard[10].ref_num = '\x1a';
              pcard[0xb].ref_num = '\x1b';
              pcard[0xc].ref_num = '\x1c';
              pcard[0xd].ref_num = '\x1d';
              for (ret = 0; ret < 0x14; ret = ret + 1) {
                pcard[ret].vfy_flags = pcard[ret].vfy_flags & 0x7f;
              }
              if (_j != (FILE *)0x0) {
                printf("\nWriting new table to %s\n",instream->_IO_read_end);
                sVar3 = fwrite(pcard,0x294,1,_j);
                if (sVar3 != 1) {
                  printf("Error writing output file %s\n",instream->_IO_read_end);
                  ptable._4_4_ = -5;
                }
                fclose(_j);
              }
              if (pcard != (card_entry_mtr1_t *)0x0) {
                free(pcard);
              }
              argv_local._4_4_ = ptable._4_4_;
            }
          }
          else {
            pcVar2 = table_to_string('\x16');
            printf("Error reading %s table.\n",pcVar2);
            free(pcard);
            fclose((FILE *)ostream);
            argv_local._4_4_ = -5;
          }
        }
        else {
          free(pcard);
          fclose((FILE *)ostream);
          argv_local._4_4_ = -5;
        }
      }
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[]) {
    FILE *instream;
    FILE *ostream = NULL;
    int   index;
    int   j;
    int   ret = 0;

    dlog_mt_card_table_mtr1_t *ptable;

    if (argc <= 1) {
        printf("Usage:\n" \
               "\tmm_card mm_table_%02x.bin [outputfile.bin]\n", TABLE_ID);
        return -1;
    }

    printf("Nortel Millennium %s Table %d (0x%02x) Dump\n\n", table_to_string(TABLE_ID), TABLE_ID, TABLE_ID);

    ptable = (dlog_mt_card_table_mtr1_t *)calloc(1, sizeof(dlog_mt_card_table_mtr1_t));

    if (ptable == NULL) {
        printf("Failed to allocate %zu bytes.\n", sizeof(dlog_mt_card_table_mtr1_t));
        return -ENOMEM;
    }

    if ((instream = fopen(argv[1], "rb")) == NULL) {
        printf("Error opening %s\n", argv[1]);
        free(ptable);
        return -ENOENT;
    }

    if (mm_validate_table_fsize(TABLE_ID, instream, sizeof(dlog_mt_card_table_mtr1_t)) != 0) {
        free(ptable);
        fclose(instream);
        return -EIO;
    }

    if (fread(ptable, sizeof(dlog_mt_card_table_mtr1_t), 1, instream) != 1) {
        printf("Error reading %s table.\n", table_to_string(TABLE_ID));
        free(ptable);
        fclose(instream);
        return -EIO;
    }

    fclose(instream);

    printf("+-------------------------------------------------------+---------------+\n" \
           "| Idx  | PAN St - End    | STD CD | Vfy | Carrier | Ref | P exp ini dis |\n" \
           "+------+-----------------+--------+-----+---------+-----+---------------+");

    for (index = 0; index < CCARD_MAX_MTR1; index++) {
        card_entry_mtr1_t *pcard = &ptable->c[index];

        if (ptable->c[index].standard_cd == 0) continue;

        printf("\n|  %2d  | %02x%02x%02x - %02x%02x%02x | %s | x%02x |   0x%02x  | x%02x | P x%02x x%02x x%02x |",
               index,
               pcard->pan_start[0],
               pcard->pan_start[1],
               pcard->pan_start[2],
               pcard->pan_end[0],
               pcard->pan_end[1],
               pcard->pan_end[2],
               standard_cd_str[(pcard->standard_cd) & 0x0F],
               pcard->vfy_flags,
               pcard->carrier_ref,
               pcard->ref_num,
               pcard->p_exp_date,
               pcard->p_init_date,
               pcard->p_disc_data);

        print_bits((pcard->vfy_flags ^ CARD_VF_CALLING_CARD_IND), (char **)str_vfy_flags);

        printf("\n|      | Service Codes: ");

        switch (pcard->standard_cd) {
            case ansi:
            case aba:
            case cba:
            case boc:
            case ansi59:
            case ccitt:

                for (j = 0; j < SVC_CODE_MAX; j++) {
                    printf("%04x,", LE16(pcard->svc_code.cc.svc_code[j]));
                }
                printf("Spill: ");

                for (j = 0; j < SPILL_STRING_LEN; j++) {
                    printf("%02x,", pcard->svc_code.cc.spill_string[j]);
                }
                printf(" TC:%02x ",   pcard->svc_code.cc.term_char);
                printf("DI:%02x |\n", pcard->svc_code.cc.discount_index);
                break;
            case smcard:
                printf("Ck Digits: ");

                for (j = 0; j < SC_CHECK_DIGIT_LEN; j++) {
                    printf("%02x,", pcard->svc_code.sc.check_digits[j]);
                }
                printf("     Ck Value: ");

                for (j = 0; j < SC_CHECK_VALUE_LEN; j++) {
                    printf("%02x,", pcard->svc_code.sc.check_value[j]);
                }
                printf(" |\n|      |                Manufacturer: ");

                for (j = 0; j < SC_MANUF_LEN; j++) {
                    printf("%02x,", pcard->svc_code.sc.manufacturer[j]);
                }

                printf("     Discount Index: %02x                 |\n",
                       pcard->svc_code.sc.discount_index);

                break;
            default:

                for (j = 0; j < SERVICE_CODE_LEN; j++) {
                    printf("%02x,", pcard->svc_code.raw[j]);
                }
                printf("         |\n");
                break;
        }
        printf("+------+-----------------+--------+-----+---------+-----+---------------+");
    }

    printf("\n");

    if (argc == 3) {
        if ((ostream = fopen(argv[2], "wb")) == NULL) {
            printf("Error opening output file %s for write.\n", argv[2]);
            return -ENOENT;
        }
    }

    /* Update CARD table */
    ptable->c[0].carrier_ref  = 0x0;
    ptable->c[1].carrier_ref  = 0x0;
    ptable->c[2].carrier_ref  = 0x0;
    ptable->c[3].carrier_ref  = 0x0;
    ptable->c[4].carrier_ref  = 0x0;
    ptable->c[5].carrier_ref  = 0x0;
    ptable->c[6].carrier_ref  = 0x0;
    ptable->c[7].carrier_ref  = 0x0;
    ptable->c[8].carrier_ref  = 0x0;
    ptable->c[9].carrier_ref  = 0x0;
    ptable->c[10].carrier_ref = 0x0;
    ptable->c[11].carrier_ref = 0x0;
    ptable->c[12].carrier_ref = 0x0;
    ptable->c[13].carrier_ref = 0x0;

    ptable->c[0].ref_num = 0x10;
    ptable->c[1].ref_num = 0x11;
    ptable->c[2].ref_num = 0x12;
    ptable->c[3].ref_num = 0x13;
    ptable->c[4].ref_num = 0x14;
    ptable->c[5].ref_num = 0x15;
    ptable->c[6].ref_num = 0x16;
    ptable->c[7].ref_num = 0x17;
    ptable->c[8].ref_num = 0x18;
    ptable->c[9].ref_num = 0x19;
    ptable->c[10].ref_num = 0x1a;
    ptable->c[11].ref_num = 0x1b;
    ptable->c[12].ref_num = 0x1c;
    ptable->c[13].ref_num = 0x1d;

    for (index = 0; index < CCARD_MAX_MTR1; index++) {
        ptable->c[index].vfy_flags &= ~CARD_VF_ACCS_ROUTING;
    }

    /* If output file was specified, write it. */
    if (ostream != NULL) {
        printf("\nWriting new table to %s\n", argv[2]);

        if (fwrite(ptable, sizeof(dlog_mt_card_table_mtr1_t), 1, ostream) != 1) {
            printf("Error writing output file %s\n", argv[2]);
            ret = -EIO;
        }
        fclose(ostream);
    }

    if (ptable != NULL) {
        free(ptable);
    }

    return ret;
}